

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

double geopolySine(double r)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (double)(~-(ulong)(r < 4.71238898038469) & (ulong)(r + -6.283185307179586) |
                  (ulong)r & -(ulong)(r < 4.71238898038469));
  if (dVar1 < 1.5707963267948966) {
    dVar2 = dVar1 * dVar1 * dVar1;
    return dVar1 * dVar1 * dVar2 * 0.0075134 + dVar1 * 0.9996949 + dVar2 * -0.16567;
  }
  dVar1 = geopolySine(dVar1 + -3.141592653589793);
  return -dVar1;
}

Assistant:

static double geopolySine(double r){
  assert( r>=-0.5*GEOPOLY_PI && r<=2.0*GEOPOLY_PI );
  if( r>=1.5*GEOPOLY_PI ){
    r -= 2.0*GEOPOLY_PI;
  }
  if( r>=0.5*GEOPOLY_PI ){
    return -geopolySine(r-GEOPOLY_PI);
  }else{
    double r2 = r*r;
    double r3 = r2*r;
    double r5 = r3*r2;
    return 0.9996949*r - 0.1656700*r3 + 0.0075134*r5;
  }
}